

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O3

int __thiscall
helics::zeromq::ZmqComms::initializeBrokerConnections(ZmqComms *this,socket_t *controlSocket)

{
  string *psVar1;
  uint uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint __val;
  socket_base sVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  size_t size;
  int *piVar11;
  string *address;
  error_t *peVar12;
  socklen_t sVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  bool bVar16;
  int __fd;
  undefined8 uVar17;
  undefined8 uVar18;
  ulong uVar20;
  context_t *context_;
  void *in_R8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_R9;
  uint __len;
  bool bVar21;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> brkprt;
  socket_t brokerReq;
  string str;
  ActionMessage M_1;
  ActionMessage M_4;
  shared_ptr<ZmqContextManager> ctx;
  message_t msg;
  pollitem_t poller;
  ActionMessage getPorts;
  int local_408;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_3d0;
  socket_t local_3a8;
  string *local_398;
  int local_38c;
  string local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338 [10];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280 [10];
  ulong local_1d8;
  string *local_190;
  ZmqContextManager local_168 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  undefined2 local_ec;
  undefined1 local_e8 [184];
  size_type sVar19;
  
  if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
    if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
      iVar6 = getDefaultPort(1);
      LOCK();
      (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = iVar6;
      UNLOCK();
      ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_protocol);
      local_e8._4_4_ = 0x5ab;
      local_e8._20_4_ = (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i
      ;
      ActionMessage::to_string_abi_cxx11_((string *)&local_348,(ActionMessage *)local_e8);
      iVar6 = zmq_send((controlSocket->super_socket_base)._handle,local_348._M_allocated_capacity,
                       local_348._8_8_,0);
      if ((iVar6 < 0) && (iVar6 = zmq_errno(), iVar6 != 0xb)) {
        peVar12 = (error_t *)__cxa_allocate_exception(0x10);
        zmq::error_t::error_t(peVar12);
        __cxa_throw(peVar12,&zmq::error_t::typeinfo,std::exception::~exception);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_allocated_capacity != local_338) {
        operator_delete((void *)local_348._M_allocated_capacity,
                        local_338[0]._M_allocated_capacity + 1);
      }
      ActionMessage::~ActionMessage((ActionMessage *)local_e8);
    }
  }
  else {
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_e8 + 0x10);
    local_e8._8_8_ = 0;
    local_e8._16_4_ = local_e8._16_4_ & 0xffffff00;
    local_e8._0_8_ = paVar15;
    ZmqContextManager::getContextPointer(local_168,(string *)local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ != paVar15) {
      operator_delete((void *)local_e8._0_8_,CONCAT44(local_e8._20_4_,local_e8._16_4_) + 1);
    }
    if ((this->super_NetworkCommsInterface).brokerPort < 0) {
      iVar6 = getDefaultPort(1);
      (this->super_NetworkCommsInterface).brokerPort = iVar6;
    }
    zmq::socket_t::socket_t(&local_3a8,*(context_t **)(local_168[0].name._M_dataplus._M_p + 0x20),3)
    ;
    local_e8._0_4_ = 0x32;
    sVar13 = 4;
    zmq::detail::socket_base::setsockopt
              (&local_3a8.super_socket_base,0x11,(int)local_e8,4,in_R8,(socklen_t)in_R9);
    psVar1 = &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress;
    gmlc::networking::makePortAddress
              ((string *)local_e8,psVar1,(this->super_NetworkCommsInterface).brokerPort + 1);
    uVar17 = local_e8._0_8_;
    zmq::detail::socket_base::connect
              (&local_3a8.super_socket_base,(int)local_e8._0_8_,__addr,sVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ != paVar15) {
      uVar17 = CONCAT44(local_e8._20_4_,local_e8._16_4_) + 1;
      operator_delete((void *)local_e8._0_8_,uVar17);
    }
    LOCK();
    (this->super_NetworkCommsInterface).hasBroker._M_base._M_i = true;
    UNLOCK();
    zmq_msg_init(&local_168[0].name.field_2);
    iVar6 = (int)uVar17;
    if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
      local_190 = &(this->super_NetworkCommsInterface).super_CommsInterface.name;
      local_1d8 = 0;
      iVar9 = 0;
      local_398 = psVar1;
      do {
        iVar6 = (int)uVar17;
        bVar21 = -1 < (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
        if (bVar21) {
          bVar21 = true;
          break;
        }
        if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i
            & 1U) != 0) {
          ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_protocol);
          local_e8._4_4_ = 0x9db;
          ActionMessage::to_string_abi_cxx11_((string *)&local_348,(ActionMessage *)local_e8);
          uVar17 = local_348._M_allocated_capacity;
          iVar9 = zmq_send((controlSocket->super_socket_base)._handle,
                           local_348._M_allocated_capacity,local_348._8_8_,0);
          iVar6 = (int)uVar17;
          if ((iVar9 < 0) && (iVar9 = zmq_errno(), iVar9 != 0xb)) {
            peVar12 = (error_t *)__cxa_allocate_exception(0x10);
            zmq::error_t::error_t(peVar12);
            __cxa_throw(peVar12,&zmq::error_t::typeinfo,std::exception::~exception);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_allocated_capacity != local_338) {
            uVar20 = local_338[0]._M_allocated_capacity + 1;
            operator_delete((void *)local_348._M_allocated_capacity,uVar20);
            iVar6 = (int)uVar20;
          }
          ActionMessage::~ActionMessage((ActionMessage *)local_e8);
          local_408 = -3;
          bVar21 = false;
          break;
        }
        NetworkCommsInterface::generatePortRequest
                  ((ActionMessage *)local_e8,&this->super_NetworkCommsInterface,
                   (this->super_NetworkCommsInterface).super_CommsInterface.serverMode + 1);
        if ((this->super_NetworkCommsInterface).super_CommsInterface.useJsonSerialization == false)
        {
          ActionMessage::to_string_abi_cxx11_(&local_368,(ActionMessage *)local_e8);
        }
        else {
          local_e8[0x1a] = local_e8[0x1a] | 0x40;
          ActionMessage::to_json_string_abi_cxx11_(&local_368,(ActionMessage *)local_e8);
        }
        uVar18 = 0;
        uVar17 = local_368._M_dataplus._M_p;
        iVar6 = zmq_send(local_3a8.super_socket_base._handle,local_368._M_dataplus._M_p,
                         local_368._M_string_length,0);
        if ((iVar6 < 0) && (iVar6 = zmq_errno(), iVar6 != 0xb)) {
          peVar12 = (error_t *)__cxa_allocate_exception(0x10);
          zmq::error_t::error_t(peVar12);
          __cxa_throw(peVar12,&zmq::error_t::typeinfo,std::exception::~exception);
        }
        local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_3a8.super_socket_base._handle;
        local_ec = 1;
        local_38c = iVar9 + 1;
        iVar6 = 0;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71((int7)((ulong)uVar18 >> 8),1);
        do {
          paVar14 = paVar15;
          paVar15 = paVar14;
          if (iVar6 == -1) goto LAB_002713f7;
          uVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x1;
          iVar7 = zmq_poll(&local_f8,1,
                           (this->super_NetworkCommsInterface).super_CommsInterface.
                           connectionTimeout.__r);
          __fd = (int)uVar17;
          if (iVar7 < 0) {
            peVar12 = (error_t *)__cxa_allocate_exception(0x10);
            zmq::error_t::error_t(peVar12);
            __cxa_throw(peVar12,&zmq::error_t::typeinfo,std::exception::~exception);
          }
          iVar6 = iVar6 + -1;
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        } while (iVar7 != 0);
        local_38c = iVar9 - iVar6;
        if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i
            & 1U) == 0) {
          if (iVar9 + -1 == iVar6) {
            message._M_str = "zmq broker connection timed out, trying again (2)";
            message._M_len = 0x31;
            CommsInterface::logWarning((CommsInterface *)this,message);
            local_290._M_allocated_capacity = (size_type)local_280;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_290,"sending message to ","");
            gmlc::networking::makePortAddress
                      (&local_3d0.first,local_398,(this->super_NetworkCommsInterface).brokerPort + 1
                      );
            uVar17 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_allocated_capacity != local_280) {
              uVar17 = local_280[0]._M_allocated_capacity;
            }
            in_R8 = (void *)local_290._8_8_;
            if ((ulong)uVar17 < local_3d0.first._M_string_length + local_290._8_8_) {
              in_R9 = &local_3d0.first.field_2;
              uVar17 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d0.first._M_dataplus._M_p != in_R9) {
                uVar17 = local_3d0.first.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar17 < local_3d0.first._M_string_length + local_290._8_8_)
              goto LAB_0027100e;
              pbVar10 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_3d0,0,0,(char *)local_290._M_allocated_capacity,
                                   local_290._8_8_);
            }
            else {
LAB_0027100e:
              pbVar10 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_290,local_3d0.first._M_dataplus._M_p,
                                   local_3d0.first._M_string_length);
            }
            local_348._M_allocated_capacity = (size_type)local_338;
            paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(pbVar10->_M_dataplus)._M_p;
            paVar15 = &pbVar10->field_2;
            if (paVar3 == paVar15) {
              local_338[0]._0_8_ = paVar15->_M_allocated_capacity;
              local_338[0]._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_338[0]._0_8_ = paVar15->_M_allocated_capacity;
              local_348._M_allocated_capacity = (size_type)paVar3;
            }
            sVar19 = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar15;
            pbVar10->_M_string_length = 0;
            paVar15->_M_local_buf[0] = '\0';
            message_00._M_str = (char *)local_348._M_allocated_capacity;
            message_00._M_len = sVar19;
            local_348._8_8_ = sVar19;
            CommsInterface::logWarning((CommsInterface *)this,message_00);
            __fd = (int)sVar19;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_allocated_capacity != local_338) {
              uVar20 = local_338[0]._M_allocated_capacity + 1;
              operator_delete((void *)local_348._M_allocated_capacity,uVar20);
              __fd = (int)uVar20;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0.first._M_dataplus._M_p != &local_3d0.first.field_2) {
              uVar20 = local_3d0.first.field_2._M_allocated_capacity + 1;
              operator_delete(local_3d0.first._M_dataplus._M_p,uVar20);
              __fd = (int)uVar20;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_allocated_capacity != local_280) {
              uVar20 = local_280[0]._M_allocated_capacity + 1;
              operator_delete((void *)local_290._M_allocated_capacity,uVar20);
              __fd = (int)uVar20;
            }
LAB_0027117d:
            zmq::socket_t::close(&local_3a8,__fd);
            context_ = *(context_t **)(local_168[0].name._M_dataplus._M_p + 0x20);
            zmq::socket_t::socket_t((socket_t *)&local_348,context_,3);
            sVar4._handle = local_3a8.super_socket_base._handle;
            local_3a8.super_socket_base._handle = (void *)local_348._M_allocated_capacity;
            local_348._M_allocated_capacity = (size_type)sVar4._handle;
            zmq::socket_t::close((socket_t *)&local_348,(int)context_);
            local_348._M_allocated_capacity._0_4_ = 0x32;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x4;
            zmq::detail::socket_base::setsockopt
                      (&local_3a8.super_socket_base,0x11,(int)&local_348,4,in_R8,(socklen_t)in_R9);
            gmlc::networking::makePortAddress
                      ((string *)&local_348,local_398,
                       (this->super_NetworkCommsInterface).brokerPort + 1);
            uVar17 = local_348._M_allocated_capacity;
            zmq::detail::socket_base::connect
                      (&local_3a8.super_socket_base,(int)local_348._M_allocated_capacity,__addr_00,
                       (socklen_t)paVar15);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_allocated_capacity != local_338) {
              uVar17 = local_338[0]._M_allocated_capacity + 1;
              operator_delete((void *)local_348._M_allocated_capacity,uVar17);
            }
            local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_3a8.super_socket_base._handle;
          }
          else {
            uVar2 = (this->super_NetworkCommsInterface).maxRetries;
            if ((iVar9 + -1) - iVar6 < (int)uVar2) goto LAB_0027117d;
            __val = -uVar2;
            if (0 < (int)uVar2) {
              __val = uVar2;
            }
            __len = 1;
            if (9 < __val) {
              uVar20 = (ulong)__val;
              uVar5 = 4;
              do {
                __len = uVar5;
                uVar8 = (uint)uVar20;
                if (uVar8 < 100) {
                  __len = __len - 2;
                  goto LAB_0027125d;
                }
                if (uVar8 < 1000) {
                  __len = __len - 1;
                  goto LAB_0027125d;
                }
                if (uVar8 < 10000) goto LAB_0027125d;
                uVar20 = uVar20 / 10000;
                uVar5 = __len + 4;
              } while (99999 < uVar8);
              __len = __len + 1;
            }
LAB_0027125d:
            local_3d0.first._M_dataplus._M_p = (pointer)&local_3d0.first.field_2;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_3d0,(ulong)(__len + -((int)uVar2 >> 0x1f)),'-');
            CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_3d0.first._M_dataplus._M_p + (uint)-((int)uVar2 >> 0x1f),__len,__val);
            in_R8 = (void *)0x2d;
            pbVar10 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_3d0,0,0,"zmq broker connection timed out after trying ",
                                 0x2d);
            local_290._M_allocated_capacity = (size_type)(pbVar10->_M_dataplus)._M_p;
            paVar15 = &pbVar10->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_allocated_capacity == paVar15) {
              local_280[0]._0_8_ = paVar15->_M_allocated_capacity;
              local_280[0]._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
              local_290._M_allocated_capacity = (size_type)local_280;
            }
            else {
              local_280[0]._0_8_ = paVar15->_M_allocated_capacity;
            }
            local_290._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar15;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            pbVar10 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_290," times (2)");
            local_348._M_allocated_capacity = (size_type)local_338;
            paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(pbVar10->_M_dataplus)._M_p;
            paVar15 = &pbVar10->field_2;
            if (paVar3 == paVar15) {
              local_338[0]._0_8_ = paVar15->_M_allocated_capacity;
              local_338[0]._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            }
            else {
              local_338[0]._0_8_ = paVar15->_M_allocated_capacity;
              local_348._M_allocated_capacity = (size_type)paVar3;
            }
            local_348._8_8_ = pbVar10->_M_string_length;
            (pbVar10->_M_dataplus)._M_p = (pointer)paVar15;
            pbVar10->_M_string_length = 0;
            (pbVar10->field_2)._M_local_buf[0] = '\0';
            message_01._M_str = (char *)local_348._M_allocated_capacity;
            message_01._M_len = local_348._8_8_;
            CommsInterface::logError((CommsInterface *)this,message_01);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_allocated_capacity != local_338) {
              operator_delete((void *)local_348._M_allocated_capacity,
                              local_338[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_allocated_capacity != local_280) {
              operator_delete((void *)local_290._M_allocated_capacity,
                              local_280[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0.first._M_dataplus._M_p != &local_3d0.first.field_2) {
              operator_delete(local_3d0.first._M_dataplus._M_p,
                              local_3d0.first.field_2._M_allocated_capacity + 1);
            }
            uVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x4;
            CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
          }
LAB_002713f7:
          uVar18 = &local_168[0].name.field_2;
          if ((this->super_NetworkCommsInterface).super_CommsInterface.txStatus._M_i == ERRORED) {
            ActionMessage::ActionMessage((ActionMessage *)&local_348,cmd_protocol);
            local_348._M_allocated_capacity._4_4_ = 0xa3f;
            ActionMessage::to_string_abi_cxx11_((string *)&local_290,(ActionMessage *)&local_348);
            uVar18 = local_290._M_allocated_capacity;
            iVar6 = zmq_send((controlSocket->super_socket_base)._handle,
                             local_290._M_allocated_capacity,local_290._8_8_,0);
            if ((iVar6 < 0) && (iVar6 = zmq_errno(), iVar6 != 0xb)) {
              peVar12 = (error_t *)__cxa_allocate_exception(0x10);
              zmq::error_t::error_t(peVar12);
              __cxa_throw(peVar12,&zmq::error_t::typeinfo,std::exception::~exception);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_allocated_capacity != local_280) {
              uVar18 = local_280[0]._M_allocated_capacity + 1;
              operator_delete((void *)local_290._M_allocated_capacity,uVar18);
            }
            ActionMessage::~ActionMessage((ActionMessage *)&local_348);
            local_408 = -1;
            goto LAB_002714a1;
          }
          if (((ulong)paVar14 & 1) == 0) {
            iVar6 = (int)uVar18;
            zmq::detail::socket_base::recv
                      (&local_3a8.super_socket_base,iVar6,(void *)0x0,(size_t)paVar15,(int)in_R8);
            uVar17 = zmq_msg_data(uVar18);
            size = zmq_msg_size(uVar18);
            ActionMessage::ActionMessage((ActionMessage *)&local_348,(void *)uVar17,size);
            if (((local_348._M_allocated_capacity._0_4_ == -60000) ||
                (local_348._M_allocated_capacity._0_4_ == 0x1000ea60)) ||
               (local_348._M_allocated_capacity._0_4_ == 60000)) {
              iVar9 = (int)in_R8;
              if (0x9da < (int)local_348._M_allocated_capacity._4_4_) {
                if (local_348._M_allocated_capacity._4_4_ == 0x9db) {
                  zmq::detail::socket_base::send
                            (&controlSocket->super_socket_base,iVar6,(void *)0x0,(size_t)paVar15,
                             iVar9);
                  local_408 = -3;
                  uVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x2;
                  CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
                }
                else {
                  if (local_348._M_allocated_capacity._4_4_ != 0xa3f) {
                    if (local_348._M_allocated_capacity._4_4_ == 0xed3) {
                      local_290._M_allocated_capacity = 2;
                      local_290._8_8_ = (void *)0x0;
                      do {
                        uVar17 = &local_290;
                        iVar6 = nanosleep((timespec *)uVar17,(timespec *)uVar17);
                        if (iVar6 != -1) break;
                        piVar11 = __errno_location();
                      } while (*piVar11 == 4);
                    }
                    goto LAB_002715a3;
                  }
                  zmq::detail::socket_base::send
                            (&controlSocket->super_socket_base,iVar6,(void *)0x0,(size_t)paVar15,
                             iVar9);
                  local_408 = -4;
                  uVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x4;
                  CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
                }
LAB_00271677:
                ActionMessage::~ActionMessage((ActionMessage *)&local_348);
                goto LAB_002714a1;
              }
              if (local_348._M_allocated_capacity._4_4_ == 0x14d) {
                message_02._M_str = "got new broker information";
                message_02._M_len = 0x1a;
                CommsInterface::logMessage((CommsInterface *)this,message_02);
                sVar13 = (socklen_t)paVar15;
                gmlc::networking::makePortAddress
                          ((string *)&local_290,local_398,
                           (this->super_NetworkCommsInterface).brokerPort + 1);
                zmq::detail::socket_base::disconnect
                          (&local_3a8.super_socket_base,(char *)local_290._M_allocated_capacity);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290._M_allocated_capacity != local_280) {
                  operator_delete((void *)local_290._M_allocated_capacity,
                                  local_280[0]._M_allocated_capacity + 1);
                }
                address = ActionMessage::getString_abi_cxx11_((ActionMessage *)&local_348,0);
                gmlc::networking::extractInterfaceAndPort(&local_3d0,(string *)address);
                (this->super_NetworkCommsInterface).brokerPort = local_3d0.second;
                iVar6 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_3d0,"?");
                psVar1 = local_398;
                if (iVar6 != 0) {
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_398,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3d0);
                }
                gmlc::networking::makePortAddress
                          ((string *)&local_290,psVar1,
                           (this->super_NetworkCommsInterface).brokerPort + 1);
                uVar17 = local_290._M_allocated_capacity;
                zmq::detail::socket_base::connect
                          (&local_3a8.super_socket_base,(int)local_290._M_allocated_capacity,
                           __addr_01,sVar13);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290._M_allocated_capacity != local_280) {
                  uVar17 = local_280[0]._M_allocated_capacity + 1;
                  operator_delete((void *)local_290._M_allocated_capacity,uVar17);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d0.first._M_dataplus._M_p != &local_3d0.first.field_2) {
                  uVar17 = local_3d0.first.field_2._M_allocated_capacity + 1;
                  operator_delete(local_3d0.first._M_dataplus._M_p,uVar17);
                }
                ActionMessage::~ActionMessage((ActionMessage *)&local_348);
                goto LAB_002715b0;
              }
              if (local_348._M_allocated_capacity._4_4_ == 0x5ab) {
                local_408 = 0;
                zmq::detail::socket_base::send
                          (&controlSocket->super_socket_base,iVar6,(void *)0x0,(size_t)paVar15,iVar9
                          );
                goto LAB_00271677;
              }
            }
LAB_002715a3:
            ActionMessage::~ActionMessage((ActionMessage *)&local_348);
          }
LAB_002715b0:
          iVar6 = (int)local_1d8;
          bVar16 = (this->super_NetworkCommsInterface).maxRetries <= iVar6;
          if (bVar16) {
            uVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x4;
            CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
            local_408 = -1;
          }
          bVar16 = !bVar16;
          local_1d8 = (ulong)(iVar6 + 1);
        }
        else {
          ActionMessage::ActionMessage((ActionMessage *)&local_348,cmd_protocol);
          local_348._M_allocated_capacity._4_4_ = 0x9db;
          ActionMessage::to_string_abi_cxx11_((string *)&local_290,(ActionMessage *)&local_348);
          uVar18 = local_290._M_allocated_capacity;
          iVar6 = zmq_send((controlSocket->super_socket_base)._handle,
                           local_290._M_allocated_capacity,local_290._8_8_,0);
          if ((iVar6 < 0) && (iVar6 = zmq_errno(), iVar6 != 0xb)) {
            peVar12 = (error_t *)__cxa_allocate_exception(0x10);
            zmq::error_t::error_t(peVar12);
            __cxa_throw(peVar12,&zmq::error_t::typeinfo,std::exception::~exception);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_allocated_capacity != local_280) {
            uVar18 = local_280[0]._M_allocated_capacity + 1;
            operator_delete((void *)local_290._M_allocated_capacity,uVar18);
          }
          ActionMessage::~ActionMessage((ActionMessage *)&local_348);
          local_408 = -3;
LAB_002714a1:
          bVar16 = false;
          uVar17 = uVar18;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != &local_368.field_2) {
          uVar17 = local_368.field_2._M_allocated_capacity + 1;
          operator_delete(local_368._M_dataplus._M_p,uVar17);
        }
        ActionMessage::~ActionMessage((ActionMessage *)local_e8);
        iVar6 = (int)uVar17;
        iVar9 = local_38c;
      } while (bVar16);
    }
    else {
      bVar21 = true;
    }
    zmq_msg_close(&local_168[0].name.field_2);
    zmq::socket_t::close(&local_3a8,iVar6);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168[0].name._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168[0].name._M_string_length)
      ;
    }
    if (!bVar21) {
      return local_408;
    }
  }
  return 0;
}

Assistant:

int ZmqComms::initializeBrokerConnections(zmq::socket_t& controlSocket)
{
    zmq::pollitem_t poller;
    if (hasBroker) {
        auto ctx = ZmqContextManager::getContextPointer();
        if (brokerPort < 0) {
            brokerPort = getDefaultBrokerPort();
        }

        zmq::socket_t brokerReq(ctx->getBaseContext(), ZMQ_REQ);
        brokerReq.setsockopt(ZMQ_LINGER, 50);
        try {
            brokerReq.connect(makePortAddress(brokerTargetAddress, brokerPort + 1));
        }
        catch (zmq::error_t& ze) {
            logError(std::string("unable to connect with broker at ") +
                     makePortAddress(brokerTargetAddress, brokerPort + 1) + ":(" + name + ")" +
                     ze.what());
            setTxStatus(ConnectionStatus::ERRORED);
            ActionMessage M(CMD_PROTOCOL);
            M.messageID = DISCONNECT_ERROR;
            controlSocket.send(M.to_string());
            return (-1);
        }

        hasBroker = true;
        zmq::message_t msg;
        if (PortNumber < 0) {
            int cnt = 0;

            int cnt2 = 0;
            while (PortNumber < 0) {
                if (requestDisconnect.load(std::memory_order_acquire)) {
                    ActionMessage M(CMD_PROTOCOL);
                    M.messageID = DISCONNECT;
                    controlSocket.send(M.to_string());
                    return (-3);
                }
                ActionMessage getPorts = generatePortRequest((serverMode) ? 2 : 1);
                if (useJsonSerialization) {
                    setActionFlag(getPorts, use_json_serialization_flag);
                }
                auto str =
                    (useJsonSerialization) ? getPorts.to_json_string() : getPorts.to_string();

                brokerReq.send(str);
                poller.socket = static_cast<void*>(brokerReq);
                poller.events = ZMQ_POLLIN;
                int rc = 0;
                while (rc == 0) {
                    ++cnt2;
                    rc = zmq::poll(&poller, 1, connectionTimeout);
                    if (rc < 0) {
                        logError("ZMQ broker connection error (2)");
                        setTxStatus(ConnectionStatus::ERRORED);
                        break;
                    }
                    if (rc == 0) {
                        if (requestDisconnect.load(std::memory_order_acquire)) {
                            ActionMessage M(CMD_PROTOCOL);
                            M.messageID = DISCONNECT;
                            controlSocket.send(M.to_string());
                            return (-3);
                        }
                        if (cnt2 == 1) {
                            logWarning("zmq broker connection timed out, trying again (2)");
                            logWarning(std::string("sending message to ") +
                                       makePortAddress(brokerTargetAddress, brokerPort + 1));
                        } else if (cnt2 > maxRetries) {
                            logError("zmq broker connection timed out after trying " +
                                     std::to_string(maxRetries) + " times (2)");
                            setTxStatus(ConnectionStatus::ERRORED);
                            break;
                        }
                        // try to reestablish the connection
                        brokerReq.close();
                        brokerReq = zmq::socket_t(ctx->getBaseContext(), ZMQ_REQ);
                        brokerReq.setsockopt(ZMQ_LINGER, 50);
                        try {
                            brokerReq.connect(makePortAddress(brokerTargetAddress, brokerPort + 1));
                            poller.socket = static_cast<void*>(brokerReq);
                        }
                        catch (zmq::error_t& ze) {
                            logError(std::string("unable to connect with broker at ") +
                                     makePortAddress(brokerTargetAddress, brokerPort + 1) + ":(" +
                                     name + ")" + ze.what());
                            setTxStatus(ConnectionStatus::ERRORED);
                            ActionMessage M(CMD_PROTOCOL);
                            M.messageID = DISCONNECT_ERROR;
                            controlSocket.send(M.to_string());
                            return (-1);
                        }
                        break;
                    }
                }

                if (getTxStatus() == ConnectionStatus::ERRORED) {
                    ActionMessage M(CMD_PROTOCOL);
                    M.messageID = DISCONNECT_ERROR;
                    controlSocket.send(M.to_string());
                    return (-1);
                }
                if (rc > 0) {
                    brokerReq.recv(msg);

                    ActionMessage rxcmd(static_cast<std::byte*>(msg.data()), msg.size());
                    if (isProtocolCommand(rxcmd)) {
                        if (rxcmd.messageID == PORT_DEFINITIONS) {
                            controlSocket.send(msg, zmq::send_flags::none);
                            return 0;
                        }
                        if (rxcmd.messageID == DISCONNECT) {
                            controlSocket.send(msg, zmq::send_flags::none);
                            setTxStatus(ConnectionStatus::TERMINATED);
                            return (-3);
                        }
                        if (rxcmd.messageID == DISCONNECT_ERROR) {
                            controlSocket.send(msg, zmq::send_flags::none);
                            setTxStatus(ConnectionStatus::ERRORED);
                            return (-4);
                        }
                        if (rxcmd.messageID == NEW_BROKER_INFORMATION) {
                            logMessage("got new broker information");
                            brokerReq.disconnect(
                                makePortAddress(brokerTargetAddress, brokerPort + 1));
                            auto brkprt =
                                gmlc::networking::extractInterfaceAndPort(rxcmd.getString(0));
                            brokerPort = brkprt.second;
                            if (brkprt.first != "?") {
                                brokerTargetAddress = brkprt.first;
                            }
                            try {
                                brokerReq.connect(
                                    makePortAddress(brokerTargetAddress, brokerPort + 1));
                            }
                            catch (zmq::error_t& ze) {
                                logError(std::string("unable to connect with broker at ") +
                                         makePortAddress(brokerTargetAddress, brokerPort + 1) +
                                         ":(" + name + ")" + ze.what());
                                setTxStatus(ConnectionStatus::ERRORED);
                                ActionMessage M(CMD_PROTOCOL);
                                M.messageID = DISCONNECT_ERROR;
                                controlSocket.send(M.to_string());
                                return (-1);
                            }
                        } else if (rxcmd.messageID == DELAY_CONNECTION) {
                            std::this_thread::sleep_for(std::chrono::seconds(2));
                        }
                    }
                }
                ++cnt;
                if (cnt > maxRetries) {
                    // we can't get the broker to respond with port numbers
                    setTxStatus(ConnectionStatus::ERRORED);
                    return (-1);
                }
            }
        }
    } else {
        if ((PortNumber < 0)) {
            PortNumber = getDefaultBrokerPort();
            ActionMessage setPorts(CMD_PROTOCOL);
            setPorts.messageID = PORT_DEFINITIONS;
            setPorts.setExtraData(PortNumber);
            auto str = setPorts.to_string();
            controlSocket.send(str);
        }
    }
    return 0;
}